

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int evalConstExpr(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  Parse *pParse_00;
  ExprList *pEVar2;
  int iVar3;
  int r2;
  int r1;
  ExprList_item *pItem;
  int i;
  ExprList *pList;
  Parse *pParse;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  uVar1 = pExpr->op;
  if (uVar1 != 'H') {
    if (uVar1 == '\\') {
      return 0;
    }
    if (uVar1 != 0x84) {
      if ((((uVar1 == 0x97) || (uVar1 == 0x99)) || (uVar1 == 0x9b)) &&
         (pEVar2 = (pExpr->x).pList, pEVar2 != (ExprList *)0x0)) {
        _r2 = pEVar2->a;
        for (pItem._4_4_ = pEVar2->nExpr; 0 < pItem._4_4_; pItem._4_4_ = pItem._4_4_ + -1) {
          if (_r2->pExpr != (Expr *)0x0) {
            _r2->pExpr->flags = _r2->pExpr->flags | 0x200;
          }
          _r2 = _r2 + 1;
        }
      }
      iVar3 = isAppropriateForFactoring(pExpr);
      if (iVar3 != 0) {
        iVar3 = pParse_00->nMem + 1;
        pParse_00->nMem = iVar3;
        iVar3 = sqlite3ExprCodeTarget(pParse_00,pExpr,iVar3);
        pExpr->op2 = pExpr->op;
        pExpr->op = 0x84;
        pExpr->iTable = iVar3;
        return 1;
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

static int evalConstExpr(Walker *pWalker, Expr *pExpr){
  Parse *pParse = pWalker->pParse;
  switch( pExpr->op ){
    case TK_IN:
    case TK_REGISTER: {
      return WRC_Prune;
    }
    case TK_COLLATE: {
      return WRC_Continue;
    }
    case TK_FUNCTION:
    case TK_AGG_FUNCTION:
    case TK_CONST_FUNC: {
      /* The arguments to a function have a fixed destination.
      ** Mark them this way to avoid generated unneeded OP_SCopy
      ** instructions. 
      */
      ExprList *pList = pExpr->x.pList;
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( pList ){
        int i = pList->nExpr;
        struct ExprList_item *pItem = pList->a;
        for(; i>0; i--, pItem++){
          if( ALWAYS(pItem->pExpr) ) pItem->pExpr->flags |= EP_FixedDest;
        }
      }
      break;
    }
  }
  if( isAppropriateForFactoring(pExpr) ){
    int r1 = ++pParse->nMem;
    int r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    /* If r2!=r1, it means that register r1 is never used.  That is harmless
    ** but suboptimal, so we want to know about the situation to fix it.
    ** Hence the following assert: */
    assert( r2==r1 );
    pExpr->op2 = pExpr->op;
    pExpr->op = TK_REGISTER;
    pExpr->iTable = r2;
    return WRC_Prune;
  }
  return WRC_Continue;
}